

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdLine.h
# Opt level: O3

void __thiscall TCLAP::CmdLine::~CmdLine(CmdLine *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *c;
  list<TCLAP::Visitor_*,_std::allocator<TCLAP::Visitor_*>_> *c_00;
  _List_node_base *p_Var2;
  pointer pcVar3;
  _List_node_base *p_Var4;
  
  (this->super_CmdLineInterface)._vptr_CmdLineInterface = (_func_int **)&PTR__CmdLine_0013e840;
  c = &this->_argDeleteOnExitList;
  ClearContainer<std::__cxx11::list<TCLAP::Arg*,std::allocator<TCLAP::Arg*>>>(c);
  c_00 = &this->_visitorDeleteOnExitList;
  ClearContainer<std::__cxx11::list<TCLAP::Visitor*,std::allocator<TCLAP::Visitor*>>>(c_00);
  if (this->_userSetOutput == false) {
    if (this->_output != (CmdLineOutput *)0x0) {
      (*this->_output->_vptr_CmdLineOutput[1])();
    }
    this->_output = (CmdLineOutput *)0x0;
  }
  p_Var4 = (c_00->super__List_base<TCLAP::Visitor_*,_std::allocator<TCLAP::Visitor_*>_>)._M_impl.
           _M_node.super__List_node_base._M_next;
  while (p_Var4 != (_List_node_base *)c_00) {
    p_Var2 = p_Var4->_M_next;
    operator_delete(p_Var4,0x18);
    p_Var4 = p_Var2;
  }
  p_Var4 = (c->super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>)._M_impl._M_node.
           super__List_node_base._M_next;
  while (p_Var4 != (_List_node_base *)c) {
    p_Var2 = p_Var4->_M_next;
    operator_delete(p_Var4,0x18);
    p_Var4 = p_Var2;
  }
  std::
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  ::~vector(&(this->_xorHandler)._orList);
  pcVar3 = (this->_version)._M_dataplus._M_p;
  paVar1 = &(this->_version).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->_message)._M_dataplus._M_p;
  paVar1 = &(this->_message).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->_progName)._M_dataplus._M_p;
  paVar1 = &(this->_progName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  p_Var4 = (this->_argList).super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  while (p_Var4 != (_List_node_base *)&this->_argList) {
    p_Var2 = p_Var4->_M_next;
    operator_delete(p_Var4,0x18);
    p_Var4 = p_Var2;
  }
  return;
}

Assistant:

inline CmdLine::~CmdLine()
{
	ClearContainer(_argDeleteOnExitList);
	ClearContainer(_visitorDeleteOnExitList);

	if ( !_userSetOutput ) {
		delete _output;
		_output = 0;
	}
}